

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtypedh.cpp
# Opt level: O0

void vmb_get_dh_val(char *buf,vm_val_t *val)

{
  int iVar1;
  unsigned_long uVar2;
  long in_RSI;
  undefined1 *in_RDI;
  
  switch(*in_RDI) {
  case 5:
  case 0x11:
    uVar2 = osrp4(in_RDI + 1);
    *(int *)(in_RSI + 8) = (int)uVar2;
    break;
  case 6:
    iVar1 = osrp2(in_RDI + 1);
    *(short *)(in_RSI + 8) = (short)iVar1;
    break;
  case 7:
    uVar2 = osrp4(in_RDI + 1);
    *(int *)(in_RSI + 8) = (int)uVar2;
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    uVar2 = osrp4(in_RDI + 1);
    *(int *)(in_RSI + 8) = (int)uVar2;
    break;
  default:
    break;
  case 0xf:
    uVar2 = osrp4(in_RDI + 1);
    *(int *)(in_RSI + 8) = (int)uVar2;
    break;
  case 0x10:
  case 0x12:
    iVar1 = osrp2(in_RDI + 1);
    *(short *)(in_RSI + 10) = (short)iVar1;
    iVar1 = osrp2(in_RDI + 3);
    *(short *)(in_RSI + 8) = (short)iVar1;
  }
  return;
}

Assistant:

void vmb_get_dh_val(const char *buf, vm_val_t *val)
{
    /* read the format appropriate to the type */
    switch((vm_datatype_t)buf[0])
    {
    case VM_OBJ:
    case VM_OBJX:
        /* get the object ID from the UINT4 */
        val->val.obj = (vm_obj_id_t)t3rp4u(buf+1);
        break;

    case VM_PROP:
        /* get the property ID from the UINT2 */
        val->val.prop = (vm_prop_id_t)osrp2(buf+1);
        break;

    case VM_INT:
        val->val.intval = osrp4(buf+1);
        break;

    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* read the function index and set index as UINT2s */
        val->val.bifptr.func_idx = osrp2(buf+1);
        val->val.bifptr.set_idx = osrp2(buf+3);
        break;

    case VM_ENUM:
        /* get the enumerated constant value from the UINT4 */
        val->val.enumval = t3rp4u(buf+1);
        break;

    case VM_SSTRING:
    case VM_DSTRING:
    case VM_LIST:
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* get the offset value from the UINT4 */
        val->val.ofs = t3rp4u(buf+1);
        break;

    default:
        /* other types have no additional data or cannot be put in a DH */
        break;
    }
}